

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall Memory::HeapBlockMap64::ResetMarks(HeapBlockMap64 *this)

{
  Node *local_18;
  Node *node;
  HeapBlockMap64 *this_local;
  
  for (local_18 = this->list; local_18 != (Node *)0x0; local_18 = local_18->next) {
    HeapBlockMap32::ResetMarks(&local_18->map);
  }
  return;
}

Assistant:

void
HeapBlockMap64::ResetMarks()
{
    Node * node = this->list;
    while (node != nullptr)
    {
        node->map.ResetMarks();
        node = node->next;
    }
}